

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initFactorRings(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  Pring *ring;
  int *cperm;
  int *rperm;
  int i;
  long_long_type in_stack_ffffffffffffffa8;
  int local_24;
  undefined8 in_stack_ffffffffffffffe8;
  int n;
  Pring **in_stack_fffffffffffffff0;
  
  n = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  lVar1 = *(long *)(in_RDI[5].data._M_elems + 6);
  lVar2 = *(long *)&in_RDI[5].exp;
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (in_stack_fffffffffffffff0,n);
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (in_stack_fffffffffffffff0,n);
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (in_stack_fffffffffffffff0,n);
  spx_alloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Pring*>
            (in_stack_fffffffffffffff0,n);
  for (local_24 = (in_RDI->data)._M_elems[1] - in_RDI[0xd].data._M_elems[8]; -1 < local_24;
      local_24 = local_24 + -1) {
    lVar4 = *(long *)(in_RDI[0xe].data._M_elems + 6) + (long)local_24 * 0x20;
    *(long *)(*(long *)(in_RDI[0xe].data._M_elems + 6) + (long)local_24 * 0x20) = lVar4;
    *(long *)(*(long *)(in_RDI[0xe].data._M_elems + 6) + (long)local_24 * 0x20 + 8) = lVar4;
    lVar4 = *(long *)&in_RDI[0xe].exp + (long)local_24 * 0x20;
    *(long *)(*(long *)&in_RDI[0xe].exp + (long)local_24 * 0x20) = lVar4;
    *(long *)(*(long *)&in_RDI[0xe].exp + (long)local_24 * 0x20 + 8) = lVar4;
  }
  local_24 = 0;
  do {
    if ((int)(in_RDI->data)._M_elems[1] <= local_24) {
      return;
    }
    if (*(int *)(lVar1 + (long)local_24 * 4) < 0) {
      if (*(int *)(*(long *)(in_RDI[10].data._M_elems + 2) + (long)local_24 * 4) < 1) {
        (in_RDI->data)._M_elems[0] = 2;
        return;
      }
      plVar3 = (long *)(*(long *)&in_RDI[0xe].exp +
                       (long)*(int *)(*(long *)(in_RDI[10].data._M_elems + 2) + (long)local_24 * 4)
                       * 0x20);
      *(long *)(*(long *)(in_RDI[0xe].data._M_elems + 8) + (long)local_24 * 0x20) = *plVar3;
      *(long *)(*(long *)(*(long *)(in_RDI[0xe].data._M_elems + 8) + (long)local_24 * 0x20) + 8) =
           *(long *)(in_RDI[0xe].data._M_elems + 8) + (long)local_24 * 0x20;
      *(long **)(*(long *)(in_RDI[0xe].data._M_elems + 8) + (long)local_24 * 0x20 + 8) = plVar3;
      *plVar3 = *(long *)(in_RDI[0xe].data._M_elems + 8) + (long)local_24 * 0x20;
      *(int *)(*(long *)(in_RDI[0xe].data._M_elems + 8) + (long)local_24 * 0x20 + 0x10) = local_24;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    *)(in_RDI + 0xd),(long)local_24);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RDI,in_stack_ffffffffffffffa8);
    }
    if (*(int *)(lVar2 + (long)local_24 * 4) < 0) {
      if (*(int *)(*(long *)(in_RDI[0xd].data._M_elems + 6) + (long)local_24 * 4) < 1) {
        (in_RDI->data)._M_elems[0] = 2;
        return;
      }
      plVar3 = (long *)(*(long *)(in_RDI[0xe].data._M_elems + 6) +
                       (long)*(int *)(*(long *)(in_RDI[0xd].data._M_elems + 6) + (long)local_24 * 4)
                       * 0x20);
      *(long *)(*(long *)(in_RDI[0xe].data._M_elems + 4) + (long)local_24 * 0x20) = *plVar3;
      *(long *)(*(long *)(*(long *)(in_RDI[0xe].data._M_elems + 4) + (long)local_24 * 0x20) + 8) =
           *(long *)(in_RDI[0xe].data._M_elems + 4) + (long)local_24 * 0x20;
      *(long **)(*(long *)(in_RDI[0xe].data._M_elems + 4) + (long)local_24 * 0x20 + 8) = plVar3;
      *plVar3 = *(long *)(in_RDI[0xe].data._M_elems + 4) + (long)local_24 * 0x20;
      *(int *)(*(long *)(in_RDI[0xe].data._M_elems + 4) + (long)local_24 * 0x20 + 0x10) = local_24;
      *(undefined4 *)(*(long *)&in_RDI[0xc].fpclass + (long)local_24 * 4) = 0;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::initFactorRings()
{
   int i;
   int* rperm = row.perm;
   int* cperm = col.perm;
   CLUFactor<R>::Pring* ring;

   assert(thedim >= 0);
   spx_alloc(temp.pivot_col,   thedim + 1);
   spx_alloc(temp.pivot_colNZ, thedim + 1);
   spx_alloc(temp.pivot_row,   thedim + 1);
   spx_alloc(temp.pivot_rowNZ, thedim + 1);

   for(i = thedim - temp.stage; i >= 0; --i)
   {
      initDR(temp.pivot_colNZ[i]);
      initDR(temp.pivot_rowNZ[i]);
   }

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0)
      {
         if(u.row.len[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_rowNZ[u.row.len[i]]);

         init2DR(temp.pivot_row[i], *ring);
         temp.pivot_row[i].idx = i;
         temp.s_max[i] = -1;
      }

      if(cperm[i] < 0)
      {
         if(temp.s_cact[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_colNZ[temp.s_cact[i]]);

         init2DR(temp.pivot_col[i], *ring);
         temp.pivot_col[i].idx = i;
         temp.s_mark[i] = 0;
      }
   }
}